

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLinearSolvers.cpp
# Opt level: O1

void __thiscall
TasGrid::TasSparse::WaveletBasisMatrix::apply<false>(WaveletBasisMatrix *this,double *x,double *r)

{
  int iVar1;
  int iVar2;
  int iVar3;
  pointer piVar4;
  pointer piVar5;
  pointer pdVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  
  iVar1 = this->num_rows;
  if (0 < (long)iVar1) {
    piVar4 = (this->pntr).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->indx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->vals).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      iVar2 = piVar4[lVar7];
      lVar8 = (long)iVar2;
      iVar3 = piVar4[lVar7 + 1];
      dVar9 = 0.0;
      if (iVar2 < iVar3) {
        do {
          dVar9 = dVar9 + pdVar6[lVar8] * x[piVar5[lVar8]];
          lVar8 = lVar8 + 1;
        } while (iVar3 != lVar8);
      }
      r[lVar7] = dVar9;
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return;
}

Assistant:

void WaveletBasisMatrix::apply(double const x[], double r[]) const{
    if (transpose){
        std::fill_n(r, num_rows, 0.0);
        for(int i=0; i<num_rows; i++){
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                r[indx[j]] += vals[j] * x[i];
        }
    }else{
        for(int i=0; i<num_rows; i++){
            double sum = 0.0;
            for(int j=pntr[i]; j<pntr[i+1]; j++)
                sum += vals[j] * x[indx[j]];
            r[i] = sum;
        }
    }
}